

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  Own<kj::UnixEventPort::ChildSet> *pOVar1;
  Exception *in_RDX;
  Promise<int> PVar2;
  Maybe<kj::Own<kj::UnixEventPort::ChildSet>_> local_70;
  undefined1 local_60 [8];
  Own<kj::UnixEventPort::ChildSet> newChildSet;
  Fault f_1;
  Own<kj::UnixEventPort::ChildSet> *c;
  ChildSet *cs;
  Fault local_28;
  Fault f;
  Maybe<int> *pid_local;
  UnixEventPort *this_local;
  
  if (((anonymous_namespace)::capturedChildExit & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xa6,FAILED,"capturedChildExit",
               "\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    _::Debug::Fault::fatal(&local_28);
  }
  f.exception = in_RDX;
  pOVar1 = _::readMaybe<kj::UnixEventPort::ChildSet>
                     ((Maybe<kj::Own<kj::UnixEventPort::ChildSet>_> *)(pid + 0x1a));
  if (pOVar1 == (Own<kj::UnixEventPort::ChildSet> *)0x0) {
    if ((((anonymous_namespace)::threadClaimedChildExits ^ 0xff) & 1) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                ((Fault *)&newChildSet.ptr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0xaf,FAILED,"!threadClaimedChildExits",
                 "\"only one UnixEvertPort per process may listen for child exits\"",
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      _::Debug::Fault::fatal((Fault *)&newChildSet.ptr);
    }
    (anonymous_namespace)::threadClaimedChildExits = 1;
    heap<kj::UnixEventPort::ChildSet>();
    c = (Own<kj::UnixEventPort::ChildSet> *)kj::Own::operator_cast_to_ChildSet_((Own *)local_60);
    pOVar1 = mv<kj::Own<kj::UnixEventPort::ChildSet>>((Own<kj::UnixEventPort::ChildSet> *)local_60);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet>_>::Maybe(&local_70,pOVar1);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet>_>::operator=
              ((Maybe<kj::Own<kj::UnixEventPort::ChildSet>_> *)(pid + 0x1a),&local_70);
    Maybe<kj::Own<kj::UnixEventPort::ChildSet>_>::~Maybe(&local_70);
    Own<kj::UnixEventPort::ChildSet>::~Own((Own<kj::UnixEventPort::ChildSet> *)local_60);
  }
  else {
    c = (Own<kj::UnixEventPort::ChildSet> *)kj::Own::operator_cast_to_ChildSet_((Own *)pOVar1);
  }
  PVar2 = newAdaptedPromise<int,kj::UnixEventPort::ChildExitPromiseAdapter,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
                    ((kj *)this,(ChildSet *)c,(Maybe<int> *)f.exception);
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<int>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_MAYBE(c, childSet) {
    cs = *c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }